

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

_Bool golf_script_get_val(golf_script_t *script,char *name,gs_val_t *val)

{
  map_base_t *m;
  map_node_t **ppmVar1;
  gs_val_t *val0;
  gs_env_t *env;
  int i;
  gs_val_t *val_local;
  char *name_local;
  golf_script_t *script_local;
  
  env._4_4_ = (script->eval).env.length;
  do {
    env._4_4_ = env._4_4_ + -1;
    if (env._4_4_ < 0) {
      return false;
    }
    m = (map_base_t *)(script->eval).env.data[env._4_4_];
    ppmVar1 = (map_node_t **)map_get_(m,name);
    m[1].buckets = ppmVar1;
  } while (ppmVar1 == (map_node_t **)0x0);
  *(map_node_t **)val = *ppmVar1;
  (val->field_2).vec2_val = *(vec2 *)(ppmVar1 + 1);
  *(map_node_t **)((long)&val->field_2 + 8) = ppmVar1[2];
  return true;
}

Assistant:

bool golf_script_get_val(golf_script_t *script, const char *name, gs_val_t *val) {
    for (int i = script->eval.env.length - 1; i >= 0; i--) {
        gs_env_t *env = script->eval.env.data[i];
        gs_val_t *val0 = map_get(&env->val_map, name);
        if (val0) {
            *val = *val0;
            return true;
        }
    }
    return false;
}